

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::HandleBadFullItem
          (cmComputeLinkInformation *this,LinkEntry *entry,string *file)

{
  cmake *pcVar1;
  cmState *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  PolicyID id_00;
  undefined1 auStack_288 [32];
  string wid;
  undefined1 local_248 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ostringstream e;
  LinkEntry fileEntry;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->Depends).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,entry);
  if (__position._M_current !=
      (this->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&this->Depends,(const_iterator)__position._M_current);
  }
  cmComputeLinkDepends::LinkEntry::LinkEntry(&fileEntry,entry);
  std::__cxx11::string::string((string *)&local_228,(string *)file);
  local_248._16_8_ = (cmLocalGenerator *)0x0;
  _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_248 + 0x10));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&e,&local_228,(cmListFileBacktrace *)(local_248 + 0x10));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&fileEntry.Item,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&e);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&e);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  std::__cxx11::string::~string((string *)&local_228);
  AddUserItem(this,&fileEntry,false);
  cmOrderDirectories::AddLinkLibrary
            ((this->OrderLinkerSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,(string *)entry);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&wid,(cmPolicies *)0x8,id);
    poVar4 = std::operator<<((ostream *)&e,(string *)&wid);
    poVar4 = std::operator<<(poVar4,"\nTarget \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\" links to item\n  ");
    poVar4 = std::operator<<(poVar4,(string *)entry);
    std::operator<<(poVar4,"\nwhich is a full-path but not a valid library file name.");
    std::__cxx11::string::~string((string *)&wid);
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)auStack_288);
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&wid,(cmListFileBacktrace *)auStack_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_288 + 8));
    std::__cxx11::string::~string((string *)&wid);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else if (PVar3 == WARN) {
    cmStrCat<char_const(&)[23],std::__cxx11::string_const&>
              (&wid,(char (*) [23])"CMP0008-WARNING-GIVEN-",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry);
    bVar2 = cmState::GetGlobalPropertyAsBool
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&wid);
    if (!bVar2) {
      this_00 = (this->CMakeInstance->State)._M_t.
                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"1",(allocator<char> *)auStack_288);
      cmState::SetGlobalProperty(this_00,&wid,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)auStack_288,(cmPolicies *)0x8,id_00);
      poVar4 = std::operator<<((ostream *)&e,(string *)auStack_288);
      poVar4 = std::operator<<(poVar4,"\nTarget \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" links to item\n  ");
      poVar4 = std::operator<<(poVar4,(string *)entry);
      std::operator<<(poVar4,"\nwhich is a full-path but not a valid library file name.");
      std::__cxx11::string::~string((string *)auStack_288);
      pcVar1 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_248);
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)auStack_288,
                          (cmListFileBacktrace *)local_248);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 8));
      std::__cxx11::string::~string((string *)auStack_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    std::__cxx11::string::~string((string *)&wid);
  }
  cmComputeLinkDepends::LinkEntry::~LinkEntry(&fileEntry);
  return;
}

Assistant:

void cmComputeLinkInformation::HandleBadFullItem(LinkEntry const& entry,
                                                 std::string const& file)
{
  std::string const& item = entry.Item.Value;
  // Do not depend on things that do not exist.
  auto i = std::find(this->Depends.begin(), this->Depends.end(), item);
  if (i != this->Depends.end()) {
    this->Depends.erase(i);
  }

  // Tell the linker to search for the item and provide the proper
  // path for it.  Do not contribute to any CMP0003 warning (do not
  // put in OldLinkDirItems or OldUserFlagItems).
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);
  this->OrderLinkerSearchPath->AddLinkLibrary(item);

  // Produce any needed message.
  switch (this->Target->GetPolicyStatusCMP0008()) {
    case cmPolicies::WARN: {
      // Print the warning at most once for this item.
      std::string wid = cmStrCat("CMP0008-WARNING-GIVEN-", item);
      if (!this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(wid)) {
        this->CMakeInstance->GetState()->SetGlobalProperty(wid, "1");
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
        /* clang-format on */
        this->CMakeInstance->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                                          this->Target->GetBacktrace());
      }
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: // NOLINT(bugprone-branch-clone)
      // OLD behavior does not warn.
      break;
    case cmPolicies::NEW:
      // NEW behavior will not get here.
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0008) << "\n"
             "Target \"" << this->Target->GetName() << "\" links to item\n"
             "  " << item << "\n"
             "which is a full-path but not a valid library file name.";
      /* clang-format on */
      this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                        this->Target->GetBacktrace());
    } break;
  }
}